

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

int Abc_NtkDontCareSimulateBefore(Odc_Man_t *p,uint *puTruth)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  
  iVar1 = p->nBits;
  iVar2 = p->nWords;
  iVar7 = 0;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    Abc_NtkDontCareSimulateSetRand(p);
    Abc_NtkDontCareSimulate(p,puTruth);
    iVar4 = 0;
    if (0 < (long)p->nWords) {
      lVar5 = 0;
      iVar4 = 0;
      do {
        iVar4 = (iVar4 + 1) - (uint)(puTruth[lVar5] == 0);
        lVar5 = lVar5 + 1;
      } while (p->nWords != lVar5);
    }
    iVar7 = iVar7 + iVar4;
    bVar3 = false;
  } while (bVar6);
  return ((iVar1 / iVar2) * iVar7) / 2;
}

Assistant:

int Abc_NtkDontCareSimulateBefore( Odc_Man_t * p, unsigned * puTruth )
{
    int nIters = 2;
    int nRounds, Counter, r;
    // decide how many rounds to simulate
    nRounds = p->nBits / p->nWords;
    Counter = 0;
    for ( r = 0; r < nIters; r++ )
    {
        Abc_NtkDontCareSimulateSetRand( p );
        Abc_NtkDontCareSimulate( p, puTruth );
        Counter += Abc_NtkDontCareCountMintsWord( p, puTruth );
    }
    // normalize
    Counter = Counter * nRounds / nIters;
    return Counter;
}